

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

void tinyexr::ReconstructTileOffsets
               (OffsetData *offset_data,EXRHeader *exr_header,uchar *head,uchar *marker,
               size_t param_5,bool isMultiPartFile,bool isDeep)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  pointer pvVar7;
  ulong uVar8;
  uchar *puVar9;
  ulong uVar10;
  pointer pvVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  pointer pvVar17;
  uint uVar18;
  ulong local_60;
  
  pvVar17 = (offset_data->offsets).
            super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar11 = (offset_data->offsets).
            super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar11 != pvVar17) {
    iVar1 = offset_data->num_x_levels;
    uVar15 = (ulong)(((uint)param_5 & 0xff) << 2);
    local_60 = 0;
    do {
      pvVar7 = pvVar17[local_60].
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pvVar17[local_60].
          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pvVar7) {
        uVar8 = 0;
        do {
          if (pvVar7[uVar8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              pvVar7[uVar8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            uVar13 = 1;
            puVar9 = marker;
            do {
              if (isMultiPartFile) {
                lVar16 = *(long *)(puVar9 + uVar15 + 0x18) +
                         *(long *)(puVar9 + uVar15 + 0x10) + uVar15 + 0x28;
              }
              else {
                lVar16 = (long)*(int *)(puVar9 + uVar15 + 0x10) + uVar15 + 0x14;
              }
              marker = puVar9 + lVar16;
              uVar2 = *(uint *)(puVar9 + uVar15);
              uVar3 = *(uint *)(puVar9 + uVar15 + 4);
              uVar12 = (ulong)uVar3;
              uVar18 = *(uint *)(puVar9 + uVar15 + 8);
              uVar14 = (ulong)uVar18;
              uVar4 = *(uint *)(puVar9 + uVar15 + 0xc);
              if ((int)(uVar2 | uVar3 | uVar4 | uVar18) < 0) {
                return;
              }
              iVar5 = offset_data->num_x_levels;
              iVar6 = exr_header->tile_level_mode;
              if (iVar6 == 2) {
                if (iVar5 <= (int)uVar18) {
                  return;
                }
                if (offset_data->num_y_levels <= (int)uVar4) {
                  return;
                }
                uVar14 = (long)iVar5 * (ulong)uVar4 + uVar14;
                uVar10 = ((long)(offset_data->offsets).
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar17 >> 3) *
                         -0x5555555555555555;
                if (uVar10 < uVar14 || uVar10 - uVar14 == 0) {
                  return;
                }
                pvVar7 = pvVar17[uVar14].
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar14 = ((long)pvVar17[uVar14].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
                         -0x5555555555555555;
                if (uVar14 < uVar12 || uVar14 - uVar12 == 0) {
                  return;
                }
                if ((ulong)((long)*(pointer *)
                                   ((long)&pvVar7[uVar12].
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data + 8) -
                            *(long *)&pvVar7[uVar12].
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data >> 3) <= (ulong)uVar2) {
                  return;
                }
                uVar18 = uVar4 * iVar1 + uVar18;
              }
              else {
                if (iVar6 == 1) {
                  if (iVar5 <= (int)uVar18) {
                    return;
                  }
                  if (offset_data->num_y_levels <= (int)uVar4) {
                    return;
                  }
                  uVar10 = ((long)(offset_data->offsets).
                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar17 >> 3) *
                           -0x5555555555555555;
                  if (uVar10 < uVar14 || uVar10 - uVar14 == 0) {
                    return;
                  }
                  pvVar7 = pvVar17[uVar14].
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  uVar14 = ((long)pvVar17[uVar14].
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
                           -0x5555555555555555;
                  if (uVar14 < uVar12 || uVar14 - uVar12 == 0) {
                    return;
                  }
                  lVar16 = (long)*(pointer *)
                                  ((long)&pvVar7[uVar12].
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data + 8) -
                           *(long *)&pvVar7[uVar12].
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data;
                }
                else {
                  if (iVar6 != 0) {
                    return;
                  }
                  if ((uVar4 | uVar18) != 0) {
                    return;
                  }
                  if ((offset_data->offsets).
                      super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish == pvVar17) {
                    return;
                  }
                  pvVar7 = (pvVar17->
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  uVar14 = ((long)(pvVar17->
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
                           -0x5555555555555555;
                  if (uVar14 < uVar12 || uVar14 - uVar12 == 0) {
                    return;
                  }
                  lVar16 = (long)*(pointer *)
                                  ((long)&pvVar7[uVar12].
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data + 8) -
                           *(long *)&pvVar7[uVar12].
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data;
                  uVar18 = 0;
                }
                if ((ulong)(lVar16 >> 3) <= (ulong)uVar2) {
                  return;
                }
              }
              *(long *)(*(long *)&pvVar17[(int)uVar18].
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[(int)uVar3].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data + (long)(int)uVar2 * 8) =
                   (long)puVar9 - (long)head;
              pvVar17 = (offset_data->offsets).
                        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pvVar7 = pvVar17[local_60].
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar14 = (ulong)uVar13;
              uVar13 = uVar13 + 1;
              puVar9 = marker;
            } while (uVar14 < (ulong)((long)pvVar7[uVar8].
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pvVar7[uVar8].
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          uVar8 = (ulong)((int)uVar8 + 1);
          uVar14 = ((long)pvVar17[local_60].
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
                   -0x5555555555555555;
        } while (uVar8 <= uVar14 && uVar14 - uVar8 != 0);
        pvVar11 = (offset_data->offsets).
                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_60 = (ulong)((int)local_60 + 1);
      uVar8 = ((long)pvVar11 - (long)pvVar17 >> 3) * -0x5555555555555555;
    } while (local_60 <= uVar8 && uVar8 - local_60 != 0);
  }
  return;
}

Assistant:

static void ReconstructTileOffsets(OffsetData& offset_data,
                                   const EXRHeader* exr_header,
                                   const unsigned char* head, const unsigned char* marker, const size_t /*size*/,
                                   bool isMultiPartFile,
                                   bool isDeep) {
  int numXLevels = offset_data.num_x_levels;
  for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
    for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
      for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {
        tinyexr::tinyexr_uint64 tileOffset = tinyexr::tinyexr_uint64(marker - head);

        if (isMultiPartFile) {
          //int partNumber;
          marker += sizeof(int);
        }

        int tileX;
        memcpy(&tileX, marker, sizeof(int));
        tinyexr::swap4(&tileX);
        marker += sizeof(int);

        int tileY;
        memcpy(&tileY, marker, sizeof(int));
        tinyexr::swap4(&tileY);
        marker += sizeof(int);

        int levelX;
        memcpy(&levelX, marker, sizeof(int));
        tinyexr::swap4(&levelX);
        marker += sizeof(int);

        int levelY;
        memcpy(&levelY, marker, sizeof(int));
        tinyexr::swap4(&levelY);
        marker += sizeof(int);

        if (isDeep) {
          tinyexr::tinyexr_int64 packed_offset_table_size;
          memcpy(&packed_offset_table_size, marker, sizeof(tinyexr::tinyexr_int64));
          tinyexr::swap8(reinterpret_cast<tinyexr::tinyexr_uint64*>(&packed_offset_table_size));
          marker += sizeof(tinyexr::tinyexr_int64);

          tinyexr::tinyexr_int64 packed_sample_size;
          memcpy(&packed_sample_size, marker, sizeof(tinyexr::tinyexr_int64));
          tinyexr::swap8(reinterpret_cast<tinyexr::tinyexr_uint64*>(&packed_sample_size));
          marker += sizeof(tinyexr::tinyexr_int64);

          // next Int64 is unpacked sample size - skip that too
          marker += packed_offset_table_size + packed_sample_size + 8;

        } else {

          int dataSize;
          memcpy(&dataSize, marker, sizeof(int));
          tinyexr::swap4(&dataSize);
          marker += sizeof(int);
          marker += dataSize;
        }

        if (!isValidTile(exr_header, offset_data,
          tileX, tileY, levelX, levelY))
          return;

        int level_idx = LevelIndex(levelX, levelY, exr_header->tile_level_mode, numXLevels);
        offset_data.offsets[size_t(level_idx)][size_t(tileY)][size_t(tileX)] = tileOffset;
      }
    }
  }
}